

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O3

void bitrv2(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  
  uVar6 = n >> 2;
  iVar14 = n >> 1;
  if ((int)uVar6 < 9) {
    uVar33 = 4;
    uVar13 = 1;
    if (uVar6 != 8) goto LAB_0011f236;
  }
  else {
    uVar13 = 1;
    do {
      uVar11 = uVar13;
      uVar13 = uVar11 * 2;
      uVar7 = uVar6 >> 2;
      bVar4 = 0x23 < uVar6;
      uVar6 = uVar7;
    } while (bVar4);
    uVar33 = (ulong)(uVar11 << 3);
    if (uVar7 != 8) {
      if ((int)uVar13 < 1) {
        return;
      }
LAB_0011f236:
      lVar29 = (long)iVar14;
      uVar26 = (ulong)uVar13;
      iVar5 = (int)uVar33;
      uVar32 = 0;
      do {
        iVar12 = 0;
        uVar10 = uVar26;
        if (uVar32 != 0) {
          uVar10 = uVar26 + uVar32;
          iVar25 = ip[uVar10];
          lVar9 = (long)iVar25;
          iVar12 = (int)uVar32 * 4;
          lVar22 = lVar29 + uVar33 + lVar9;
          lVar15 = (lVar22 << 0x20) + 0x300000000;
          lVar27 = 0;
          uVar34 = uVar32;
          do {
            lVar23 = (long)iVar12 + (long)*(int *)((long)ip + lVar27 + uVar26 * 4);
            dVar1 = a[lVar9 + lVar27];
            dVar2 = (a + lVar9 + lVar27)[1];
            dVar3 = (a + lVar23)[1];
            a[lVar9 + lVar27] = a[lVar23];
            (a + lVar9 + lVar27)[1] = dVar3;
            a[lVar23] = dVar1;
            (a + lVar23)[1] = dVar2;
            iVar19 = (int)lVar23;
            iVar8 = iVar19 + iVar5;
            dVar1 = a[uVar33 + lVar9 + lVar27];
            dVar2 = (a + uVar33 + lVar9 + lVar27)[1];
            dVar3 = (a + iVar8)[1];
            a[uVar33 + lVar9 + lVar27] = a[iVar8];
            (a + uVar33 + lVar9 + lVar27)[1] = dVar3;
            a[iVar8] = dVar1;
            (a + iVar8)[1] = dVar2;
            dVar2 = a[lVar22 + lVar27];
            dVar3 = (a + lVar22 + lVar27)[1];
            dVar1 = a[(long)iVar8 + 3];
            a[lVar22 + lVar27] = a[(long)iVar8 + 2];
            a[lVar22 + lVar27 + 1] = dVar1;
            a[(long)iVar8 + 2] = dVar2;
            (a + (long)iVar8 + 2)[1] = dVar3;
            dVar1 = (a + (iVar19 + 2))[1];
            dVar2 = a[lVar29 + lVar9 + lVar27];
            dVar3 = (a + lVar29 + lVar9 + lVar27)[1];
            a[lVar29 + lVar9 + lVar27] = a[iVar19 + 2];
            (a + lVar29 + lVar9 + lVar27)[1] = dVar1;
            a[iVar19 + 2] = dVar2;
            (a + (iVar19 + 2))[1] = dVar3;
            iVar28 = iVar19 + 2 + iVar14;
            dVar1 = a[lVar29 + lVar9 + lVar27 + 2];
            dVar2 = (a + lVar29 + lVar9 + lVar27 + 2)[1];
            dVar3 = (a + iVar28)[1];
            a[lVar29 + lVar9 + lVar27 + 2] = a[iVar28];
            (a + lVar29 + lVar9 + lVar27 + 2)[1] = dVar3;
            a[iVar28] = dVar1;
            (a + iVar28)[1] = dVar2;
            iVar28 = (int)lVar27;
            iVar16 = iVar5 + 2 + iVar14 + iVar25 + iVar28;
            dVar1 = a[iVar16];
            dVar2 = *(double *)((long)a + (lVar15 >> 0x1d));
            lVar23 = (long)(iVar14 + 2 + iVar8);
            dVar3 = a[lVar23 + 1];
            a[iVar16] = a[lVar23];
            *(double *)((long)a + (lVar15 >> 0x1d)) = dVar3;
            a[lVar23] = dVar1;
            a[lVar23 + 1] = dVar2;
            iVar16 = iVar5 + 2 + iVar25 + iVar28;
            dVar1 = a[iVar16];
            dVar2 = (a + iVar16)[1];
            dVar3 = (a + (iVar8 + iVar14))[1];
            a[iVar16] = a[iVar8 + iVar14];
            (a + iVar16)[1] = dVar3;
            a[iVar8 + iVar14] = dVar1;
            (a + (iVar8 + iVar14))[1] = dVar2;
            iVar28 = iVar25 + 2 + iVar28;
            dVar1 = a[iVar28];
            dVar2 = (a + iVar28)[1];
            dVar3 = (a + (iVar19 + iVar14))[1];
            a[iVar28] = a[iVar19 + iVar14];
            (a + iVar28)[1] = dVar3;
            a[iVar19 + iVar14] = dVar1;
            (a + (iVar19 + iVar14))[1] = dVar2;
            lVar27 = lVar27 + 4;
            lVar15 = lVar15 + 0x400000000;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
        }
        iVar25 = ip[uVar10];
        lVar22 = (long)iVar25 + (long)iVar12;
        dVar1 = a[lVar22 + 2];
        iVar28 = (int)lVar22;
        iVar19 = iVar28 + iVar14;
        dVar2 = a[(long)iVar28 + 3];
        dVar3 = a[(long)iVar19 + 1];
        a[lVar22 + 2] = a[iVar19];
        a[(long)iVar28 + 3] = dVar3;
        a[iVar19] = dVar1;
        a[(long)iVar19 + 1] = dVar2;
        iVar12 = iVar25 + iVar12 + 2 + iVar5;
        dVar1 = a[iVar12];
        dVar2 = (a + iVar12)[1];
        dVar3 = (a + (iVar19 + iVar5))[1];
        a[iVar12] = a[iVar19 + iVar5];
        (a + iVar12)[1] = dVar3;
        a[iVar19 + iVar5] = dVar1;
        (a + (iVar19 + iVar5))[1] = dVar2;
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar26);
      return;
    }
    if ((int)uVar13 < 1) {
      return;
    }
  }
  lVar29 = (long)iVar14;
  uVar26 = (ulong)uVar13;
  iVar12 = uVar13 * 8;
  iVar5 = (int)uVar33;
  uVar32 = 0;
  do {
    iVar25 = 0;
    uVar10 = uVar26;
    if (uVar32 != 0) {
      uVar10 = uVar26 + uVar32;
      iVar19 = ip[uVar10];
      lVar30 = (long)iVar19;
      iVar28 = iVar19 * 2;
      lVar22 = lVar29 + uVar33 + lVar30 * 2;
      lVar9 = lVar29 + uVar33 * 2 + lVar30 * 2;
      lVar27 = uVar33 * 3 + lVar29 + lVar30 * 2;
      lVar24 = lVar30 << 0x21;
      iVar25 = (int)uVar32 * 4;
      lVar23 = 0;
      lVar15 = lVar29 << 0x20;
      uVar34 = uVar32;
      do {
        lVar20 = (long)iVar25 + (long)*(int *)((long)ip + lVar23 + uVar26 * 4) * 2;
        dVar1 = a[lVar30 * 2 + lVar23];
        dVar2 = a[lVar30 * 2 + lVar23 + 1];
        uVar6 = (uint)lVar20;
        dVar3 = a[(int)(uVar6 | 1)];
        a[lVar30 * 2 + lVar23] = a[lVar20];
        a[lVar30 * 2 + lVar23 + 1] = dVar3;
        a[lVar20] = dVar1;
        a[(int)(uVar6 | 1)] = dVar2;
        iVar16 = uVar6 + iVar12;
        dVar1 = a[uVar33 + lVar30 * 2 + lVar23];
        dVar2 = a[uVar33 + lVar30 * 2 + lVar23 + 1];
        iVar8 = uVar6 + 1 + iVar12;
        dVar3 = a[iVar8];
        a[uVar33 + lVar30 * 2 + lVar23] = a[iVar16];
        a[uVar33 + lVar30 * 2 + lVar23 + 1] = dVar3;
        a[iVar16] = dVar1;
        a[iVar8] = dVar2;
        uVar6 = iVar16 - iVar5;
        dVar1 = a[uVar33 * 2 + lVar30 * 2 + lVar23];
        dVar2 = a[uVar33 * 2 + lVar30 * 2 + lVar23 + 1];
        dVar3 = a[(int)(uVar6 | 1)];
        a[uVar33 * 2 + lVar30 * 2 + lVar23] = a[(int)uVar6];
        a[uVar33 * 2 + lVar30 * 2 + lVar23 + 1] = dVar3;
        a[(int)uVar6] = dVar1;
        a[(int)(uVar6 | 1)] = dVar2;
        dVar1 = a[uVar33 * 3 + lVar30 * 2 + lVar23];
        dVar2 = a[uVar33 * 3 + lVar30 * 2 + lVar23 + 1];
        lVar20 = (long)(int)(uVar6 + iVar12);
        iVar8 = uVar6 + 1 + iVar12;
        dVar3 = a[iVar8];
        a[uVar33 * 3 + lVar30 * 2 + lVar23] = a[lVar20];
        a[uVar33 * 3 + lVar30 * 2 + lVar23 + 1] = dVar3;
        a[lVar20] = dVar1;
        a[iVar8] = dVar2;
        dVar1 = a[lVar27 + lVar23];
        dVar2 = (a + lVar27 + lVar23)[1];
        dVar3 = (a + lVar20 + 2)[1];
        a[lVar27 + lVar23] = a[lVar20 + 2];
        (a + lVar27 + lVar23)[1] = dVar3;
        a[lVar20 + 2] = dVar1;
        (a + lVar20 + 2)[1] = dVar2;
        dVar1 = a[lVar9 + lVar23];
        dVar2 = (a + lVar9 + lVar23)[1];
        dVar3 = (a + (int)(uVar6 + 2))[1];
        a[lVar9 + lVar23] = a[(int)(uVar6 + 2)];
        (a + lVar9 + lVar23)[1] = dVar3;
        a[(int)(uVar6 + 2)] = dVar1;
        (a + (int)(uVar6 + 2))[1] = dVar2;
        iVar16 = uVar6 + 2 + iVar5;
        dVar1 = a[lVar22 + lVar23];
        dVar2 = (a + lVar22 + lVar23)[1];
        dVar3 = (a + iVar16)[1];
        a[lVar22 + lVar23] = a[iVar16];
        (a + lVar22 + lVar23)[1] = dVar3;
        iVar8 = iVar16 + uVar13 * -8;
        a[iVar16] = dVar1;
        (a + iVar16)[1] = dVar2;
        dVar1 = (a + iVar8)[1];
        dVar2 = a[lVar29 + lVar30 * 2 + lVar23];
        dVar3 = (a + lVar29 + lVar30 * 2 + lVar23)[1];
        a[lVar29 + lVar30 * 2 + lVar23] = a[iVar8];
        (a + lVar29 + lVar30 * 2 + lVar23)[1] = dVar1;
        a[iVar8] = dVar2;
        (a + iVar8)[1] = dVar3;
        dVar1 = a[lVar29 + lVar30 * 2 + lVar23 + 2];
        dVar2 = (a + lVar29 + lVar30 * 2 + lVar23 + 2)[1];
        dVar3 = (a + (iVar8 + iVar14))[1];
        a[lVar29 + lVar30 * 2 + lVar23 + 2] = a[iVar8 + iVar14];
        (a + lVar29 + lVar30 * 2 + lVar23 + 2)[1] = dVar3;
        a[iVar8 + iVar14] = dVar1;
        (a + (iVar8 + iVar14))[1] = dVar2;
        lVar20 = (long)(lVar24 + (uVar33 << 0x20) + 0x200000000 + lVar15) >> 0x1d;
        dVar1 = *(double *)((long)a + lVar20);
        lVar31 = (long)((uVar33 << 0x20) + 0x300000000 + lVar24 + lVar15) >> 0x1d;
        dVar2 = *(double *)((long)a + lVar31);
        lVar21 = (long)(iVar16 + iVar14);
        dVar3 = a[lVar21 + 1];
        *(double *)((long)a + lVar20) = a[lVar21];
        *(double *)((long)a + lVar31) = dVar3;
        a[lVar21] = dVar1;
        iVar8 = uVar6 + iVar14;
        iVar16 = iVar8 + 2;
        lVar31 = (long)((uVar33 << 0x21) + 0x200000000 + lVar24 + lVar15) >> 0x1d;
        a[lVar21 + 1] = dVar2;
        dVar1 = *(double *)((long)a + lVar31);
        lVar20 = (long)((uVar33 << 0x21) + 0x300000000 + lVar24 + lVar15) >> 0x1d;
        dVar2 = *(double *)((long)a + lVar20);
        dVar3 = a[(long)iVar16 + 1];
        *(double *)((long)a + lVar31) = a[iVar16];
        *(double *)((long)a + lVar20) = dVar3;
        a[iVar16] = dVar1;
        iVar18 = (int)lVar23;
        iVar17 = iVar28 + iVar5 * 3 + iVar14 + 2 + iVar18;
        a[(long)iVar16 + 1] = dVar2;
        dVar1 = a[iVar17];
        lVar21 = (long)((uVar33 * 3 << 0x20) + 0x300000000 + lVar24 + lVar15) >> 0x1d;
        dVar2 = *(double *)((long)a + lVar21);
        lVar20 = (long)(iVar16 + iVar12);
        dVar3 = a[lVar20 + 1];
        a[iVar17] = a[lVar20];
        *(double *)((long)a + lVar21) = dVar3;
        a[lVar20] = dVar1;
        a[lVar20 + 1] = dVar2;
        lVar21 = (long)(iVar5 * 3 + 2 + iVar28 + iVar18);
        dVar2 = a[lVar21];
        dVar3 = (a + lVar21)[1];
        dVar1 = a[lVar20 + -1];
        a[lVar21] = a[lVar20 + -2];
        a[lVar21 + 1] = dVar1;
        a[lVar20 + -2] = dVar2;
        (a + lVar20 + -2)[1] = dVar3;
        iVar17 = (iVar5 + iVar19) * 2 + 2 + iVar18;
        dVar1 = a[iVar17];
        dVar2 = (a + iVar17)[1];
        dVar3 = (a + iVar8)[1];
        a[iVar17] = a[iVar8];
        (a + iVar17)[1] = dVar3;
        a[iVar8] = dVar1;
        (a + iVar8)[1] = dVar2;
        iVar8 = iVar5 + 2 + iVar28 + iVar18;
        iVar16 = iVar5 + -2 + iVar16;
        dVar1 = a[iVar8];
        dVar2 = (a + iVar8)[1];
        dVar3 = (a + iVar16)[1];
        a[iVar8] = a[iVar16];
        (a + iVar8)[1] = dVar3;
        a[iVar16] = dVar1;
        (a + iVar16)[1] = dVar2;
        iVar18 = iVar28 + 2 + iVar18;
        iVar16 = iVar16 + uVar13 * -8;
        dVar1 = a[iVar18];
        dVar2 = (a + iVar18)[1];
        dVar3 = (a + iVar16)[1];
        a[iVar18] = a[iVar16];
        (a + iVar18)[1] = dVar3;
        a[iVar16] = dVar1;
        (a + iVar16)[1] = dVar2;
        lVar23 = lVar23 + 4;
        lVar15 = lVar15 + 0x400000000;
        uVar34 = uVar34 - 1;
      } while (uVar34 != 0);
    }
    iVar19 = ip[uVar10];
    lVar22 = (long)iVar25 + (long)iVar19 * 2;
    dVar1 = a[lVar22 + 2];
    iVar28 = (int)lVar22;
    iVar8 = iVar28 + iVar14;
    dVar2 = a[(long)iVar28 + 3];
    dVar3 = a[(long)iVar8 + 1];
    a[lVar22 + 2] = a[iVar8];
    a[(long)iVar28 + 3] = dVar3;
    a[iVar8] = dVar1;
    a[(long)iVar8 + 1] = dVar2;
    iVar25 = iVar25 + iVar19 * 2 + 2 + iVar5;
    iVar8 = iVar8 + iVar12;
    dVar1 = a[iVar25];
    dVar2 = (a + iVar25)[1];
    dVar3 = (a + iVar8)[1];
    a[iVar25] = a[iVar8];
    (a + iVar25)[1] = dVar3;
    a[iVar8] = dVar1;
    (a + iVar8)[1] = dVar2;
    iVar25 = iVar25 + iVar5;
    iVar8 = iVar8 - iVar5;
    dVar1 = (a + iVar8)[1];
    dVar2 = a[iVar25];
    dVar3 = (a + iVar25)[1];
    a[iVar25] = a[iVar8];
    (a + iVar25)[1] = dVar1;
    a[iVar8] = dVar2;
    (a + iVar8)[1] = dVar3;
    dVar1 = a[(long)iVar25 + -2];
    dVar2 = (a + (long)iVar25 + -2)[1];
    dVar3 = (a + (iVar8 - iVar14))[1];
    a[(long)iVar25 + -2] = a[iVar8 - iVar14];
    (a + (long)iVar25 + -2)[1] = dVar3;
    a[iVar8 - iVar14] = dVar1;
    (a + (iVar8 - iVar14))[1] = dVar2;
    lVar22 = (long)(iVar25 + iVar14);
    dVar1 = a[lVar22];
    dVar2 = a[lVar22 + 1];
    dVar3 = a[iVar8 + 3];
    a[lVar22] = a[iVar8 + 2];
    a[lVar22 + 1] = dVar3;
    a[iVar8 + 2] = dVar1;
    a[iVar8 + 3] = dVar2;
    dVar1 = a[iVar25 + iVar5];
    dVar2 = (a + (iVar25 + iVar5))[1];
    dVar3 = (a + (iVar8 + iVar12))[1];
    a[iVar25 + iVar5] = a[iVar8 + iVar12];
    (a + (iVar25 + iVar5))[1] = dVar3;
    a[iVar8 + iVar12] = dVar1;
    (a + (iVar8 + iVar12))[1] = dVar2;
    uVar32 = uVar32 + 1;
  } while (uVar32 != uVar26);
  return;
}

Assistant:

void bitrv2(int n, int *ip, FFTFLT *a)
{
    int j, j1, k, k1, l, m, nh, nm;
    FFTFLT xr, xi, yr, yi;

    m = 1;
    for (l = n >> 2; l > 8; l >>= 2) {
        m <<= 1;
    }
    nh = n >> 1;
    nm = 4 * m;
    if (l == 8) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 4 * j + 2 * ip[m + k];
                k1 = 4 * k + 2 * ip[m + j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 += 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 -= nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 += 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nh;
                k1 += 2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 -= 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 += nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 -= 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += 2;
                k1 += nh;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 += 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 -= nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 += 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nh;
                k1 -= 2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 -= 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 += nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 -= 2 * nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 4 * k + 2 * ip[m + k];
            j1 = k1 + 2;
            k1 += nh;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            j1 += nm;
            k1 += 2 * nm;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            j1 += nm;
            k1 -= nm;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            j1 -= 2;
            k1 -= nh;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            j1 += nh + 2;
            k1 += nh + 2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            j1 -= nh - nm;
            k1 += 2 * nm - 2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 4 * j + ip[m + k];
                k1 = 4 * k + ip[m + j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 += nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nh;
                k1 += 2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 -= nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += 2;
                k1 += nh;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += nm;
                k1 += nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nh;
                k1 -= 2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 -= nm;
                k1 -= nm;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 4 * k + ip[m + k];
            j1 = k1 + 2;
            k1 += nh;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            j1 += nm;
            k1 += nm;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    }
}